

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O3

void __thiscall MainWindow::closeEvent(MainWindow *this,QCloseEvent *evt)

{
  bool bVar1;
  QSettings settings;
  QByteArray local_60;
  QVariant local_48;
  QSettings local_28 [16];
  
  bVar1 = maybeSave(this);
  if (bVar1) {
    QSettings::QSettings(local_28,(QObject *)0x0);
    QSettings::beginGroup((QString *)local_28);
    QWidget::saveGeometry();
    QVariant::QVariant(&local_48,&local_60);
    QSettings::setValue((QString *)local_28,(QVariant *)MainWindowTU::KEY_GEOMETRY);
    QVariant::~QVariant(&local_48);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,8);
      }
    }
    QMainWindow::saveState((int)&local_60);
    QVariant::QVariant(&local_48,&local_60);
    QSettings::setValue((QString *)local_28,(QVariant *)MainWindowTU::KEY_WINDOW_STATE);
    QVariant::~QVariant(&local_48);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,8);
      }
    }
    QSplitter::saveState();
    QVariant::QVariant(&local_48,&local_60);
    QSettings::setValue((QString *)local_28,(QVariant *)MainWindowTU::KEY_HSPLITTER);
    QVariant::~QVariant(&local_48);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,8);
      }
    }
    QSplitter::saveState();
    QVariant::QVariant(&local_48,&local_60);
    QSettings::setValue((QString *)local_28,(QVariant *)MainWindowTU::KEY_VSPLITTER);
    QVariant::~QVariant(&local_48);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,8);
      }
    }
    evt[0xc] = (QCloseEvent)0x1;
    QSettings::~QSettings(local_28);
  }
  else {
    evt[0xc] = (QCloseEvent)0x0;
  }
  return;
}

Assistant:

void MainWindow::closeEvent(QCloseEvent *evt) {
    if (maybeSave()) {
        // user saved or discarded changes, close the window
        #ifdef QT_DEBUG
        if (mSaveConfig) {
        #endif
            QSettings settings;
            settings.beginGroup(TU::KEY_MAIN_WINDOW);
            settings.setValue(TU::KEY_GEOMETRY, saveGeometry());
            settings.setValue(TU::KEY_WINDOW_STATE, saveState(TU::WINDOW_STATE_VERSION));
            // splitters
            settings.setValue(TU::KEY_HSPLITTER, mHSplitter->saveState());
            settings.setValue(TU::KEY_VSPLITTER, mVSplitter->saveState());
        #ifdef QT_DEBUG
        }
        #endif
        evt->accept();
    } else {
        // user aborted closing, ignore this event
        evt->ignore();
    }
    
}